

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void error<String,String,String>(char *fmtstr,String *args,String *args_1,String *args_2)

{
  String local_68;
  String local_48;
  String *local_28;
  String *args_local_2;
  String *args_local_1;
  String *args_local;
  char *fmtstr_local;
  
  local_28 = args_2;
  args_local_2 = args_1;
  args_local_1 = args;
  args_local = (String *)fmtstr;
  String::String(&local_68,fmtstr);
  format<String,String,String>(&local_48,&local_68,args_local_1,args_local_2,local_28);
  error(&local_48);
  String::~String(&local_48);
  String::~String(&local_68);
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}